

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::AVisitor<hiberlite::LoadBean>::startWalk<WrappedBytes>
          (AVisitor<hiberlite::LoadBean> *this,WrappedBytes *obj,bean_key *key)

{
  string ClassName;
  allocator local_c9;
  string local_c8;
  string local_a8;
  string local_88 [32];
  stack<hiberlite::Scope,_std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>_> local_68
  ;
  
  bean_key::operator=(&this->rootKey,key);
  std::stack<hiberlite::Scope,std::deque<hiberlite::Scope,std::allocator<hiberlite::Scope>>>::
  stack<std::deque<hiberlite::Scope,std::allocator<hiberlite::Scope>>,void>(&local_68);
  std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::_M_move_assign1
            (&(this->stack).c,&local_68);
  std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::~deque(&local_68.c);
  Database::getClassName<WrappedBytes>();
  std::__cxx11::string::string((string *)&local_a8,local_88);
  std::__cxx11::string::string((string *)&local_c8,"",&local_c9);
  Scope::Scope((Scope *)&local_68,&local_a8,&local_c8);
  Scope::operator=(&this->scope,(Scope *)&local_68);
  Scope::~Scope((Scope *)&local_68);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  LoadBean::notifyInitWalk<hiberlite::AVisitor<hiberlite::LoadBean>>(this->actor,this);
  WrappedBytes::hibernate<hiberlite::AVisitor<hiberlite::LoadBean>>(obj,this);
  LoadBean::notifyDoneWalk<hiberlite::AVisitor<hiberlite::LoadBean>>(this->actor,this);
  std::__cxx11::string::~string(local_88);
  return;
}

Assistant:

void AVisitor<C>::startWalk(Y& obj, bean_key key)
{
	rootKey=key;
	stack=std::stack<Scope>();
	std::string ClassName=Database::getClassName<Y>();
	scope=Scope(ClassName,"");

	actor->notifyInitWalk(*this);
		walk(obj);
	actor->notifyDoneWalk(*this);
}